

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O2

void __thiscall cmConfigureLog::WriteBacktrace(cmConfigureLog *this,cmMakefile *mf)

{
  bool bVar1;
  cmake *this_00;
  string *psVar2;
  cmListFileContext *pcVar3;
  string_view key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  backtrace;
  cmListFileBacktrace bt;
  string root;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  cmListFileContext t;
  ostringstream s;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0 [46];
  
  backtrace.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  backtrace.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  backtrace.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = cmMakefile::GetCMakeInstance(mf);
  psVar2 = cmake::GetHomeDirectory_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)&root,(string *)psVar2);
  cmMakefile::GetBacktrace((cmMakefile *)&bt);
  while( true ) {
    bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                      ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&bt);
    if (bVar1) break;
    pcVar3 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                       ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&bt);
    cmListFileContext::cmListFileContext(&t,pcVar3);
    if ((t.Name._M_string_length != 0) || (t.Line == -1)) {
      cmSystemTools::RelativeIfUnder((string *)&s,&root,&t.FilePath);
      std::__cxx11::string::operator=((string *)&t.FilePath,(string *)&s);
      std::__cxx11::string::~string((string *)&s);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      operator<<((ostream *)&s,&t);
      std::__cxx11::stringbuf::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&backtrace,
                 &local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    }
    cmListFileContext::~cmListFileContext(&t);
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::Pop
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&s);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 *)&bt,(__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        *)&s);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1a0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  key._M_str = "backtrace";
  key._M_len = 9;
  WriteValue(this,key,&backtrace);
  std::__cxx11::string::~string((string *)&root);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&backtrace);
  return;
}

Assistant:

void cmConfigureLog::WriteBacktrace(cmMakefile const& mf)
{
  std::vector<std::string> backtrace;
  auto root = mf.GetCMakeInstance()->GetHomeDirectory();
  for (auto bt = mf.GetBacktrace(); !bt.Empty(); bt = bt.Pop()) {
    auto t = bt.Top();
    if (!t.Name.empty() || t.Line == cmListFileContext::DeferPlaceholderLine) {
      t.FilePath = cmSystemTools::RelativeIfUnder(root, t.FilePath);
      std::ostringstream s;
      s << t;
      backtrace.emplace_back(s.str());
    }
  }
  this->WriteValue("backtrace"_s, backtrace);
}